

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
WriteCallArg(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
             *this,Expr arg)

{
  Writer *this_00;
  ExprBase EVar1;
  byte *pbVar2;
  byte value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  
  if (0xffffffd0 < *(int *)arg.super_ExprBase.impl_ - 0x30U) {
    Visit(this,(NumericExpr)arg.super_ExprBase.impl_,0);
    return;
  }
  value_00.size_ = 1;
  value_00.data_ = "\'";
  fmt::BasicWriter<char>::operator<<(this->writer_,value_00);
  EVar1.impl_ = (Impl *)0x0;
  if (*(int *)arg.super_ExprBase.impl_ == 0x46) {
    EVar1.impl_ = (Impl *)arg.super_ExprBase.impl_;
  }
  pbVar2 = (byte *)(EVar1.impl_ + 1);
  do {
    value = *pbVar2;
    if (value == 10) {
      this_00 = fmt::BasicWriter<char>::operator<<(this->writer_,'\\');
      value = 10;
    }
    else {
      if (value == 0x27) {
        fmt::BasicWriter<char>::operator<<(this->writer_,'\'');
      }
      else if (value == 0) {
        value_01.size_ = 1;
        value_01.data_ = "\'";
        fmt::BasicWriter<char>::operator<<(this->writer_,value_01);
        return;
      }
      this_00 = this->writer_;
    }
    fmt::BasicWriter<char>::operator<<(this_00,value);
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteCallArg(Expr arg) {
  if (NumericExpr e = ExprTypes::template Cast<NumericExpr>(arg)) {
    Visit(e, prec::UNKNOWN);
    return;
  }
  assert(arg.kind() == expr::STRING);
  writer_ << "'";
  const char *s = ExprTypes::template Cast<StringLiteral>(arg).value();
  for ( ; *s; ++s) {
    char c = *s;
    switch (c) {
    case '\n':
      writer_ << '\\' << c;
      break;
    case '\'':
      // Escape quote by doubling.
      writer_ << c;
      // Fall through.
    default:
      writer_ << c;
    }
  }
  writer_ << "'";
}